

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

void AI::encodeEngramIfUnique
               (Stimulus stimulus,vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  undefined1 local_c0 [8];
  Engram engram_3;
  Engram *engram_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *__range2_1;
  undefined1 local_68 [7];
  bool seenBefore;
  Engram engram_1;
  Engram *engram;
  iterator __end2;
  iterator __begin2;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *__range2;
  bool heardBefore;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams_local;
  
  if (stimulus.type == Auditory) {
    bVar2 = false;
    __end2 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::begin(engrams);
    engram = (Engram *)std::vector<AI::Engram,_std::allocator<AI::Engram>_>::end(engrams);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                                       *)&engram), bVar3) {
      engram_1._40_8_ =
           __gnu_cxx::
           __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>::
           operator*(&__end2);
      if ((((reference)engram_1._40_8_)->type == Heard) &&
         ((((reference)engram_1._40_8_)->stimulus).field_3.visual.tag == stimulus.field_3.visual.tag
         )) {
        fVar1 = (((reference)engram_1._40_8_)->stimulus).x;
        if ((fVar1 == stimulus.x) && (!NAN(fVar1) && !NAN(stimulus.x))) {
          fVar1 = (((reference)engram_1._40_8_)->stimulus).y;
          if ((fVar1 == stimulus.y) && (!NAN(fVar1) && !NAN(stimulus.y))) {
            bVar2 = true;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>::
      operator++(&__end2);
    }
    if (!bVar2) {
      engram_1.stimulus.type = Auditory;
      engram_1.stimulus._36_4_ = 0;
      memcpy(local_68,&stimulus,0x28);
      std::vector<AI::Engram,_std::allocator<AI::Engram>_>::push_back
                (engrams,(value_type *)local_68);
    }
  }
  else {
    bVar2 = false;
    __end2_1 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::begin(engrams);
    engram_2 = (Engram *)std::vector<AI::Engram,_std::allocator<AI::Engram>_>::end(engrams);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                               *)&engram_2), bVar3) {
      engram_3._40_8_ =
           __gnu_cxx::
           __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>::
           operator*(&__end2_1);
      if ((((reference)engram_3._40_8_)->type == Saw) &&
         ((((reference)engram_3._40_8_)->stimulus).field_3.visual.tag == stimulus.field_3.visual.tag
         )) {
        fVar1 = (((reference)engram_3._40_8_)->stimulus).x;
        if ((fVar1 == stimulus.x) && (!NAN(fVar1) && !NAN(stimulus.x))) {
          fVar1 = (((reference)engram_3._40_8_)->stimulus).y;
          if (((fVar1 == stimulus.y) && (!NAN(fVar1) && !NAN(stimulus.y))) &&
             ((((reference)engram_3._40_8_)->stimulus).field_3.visual.target ==
              stimulus.field_3.visual.target)) {
            bVar2 = true;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>::
      operator++(&__end2_1);
    }
    if (!bVar2) {
      engram_3.stimulus.type = Visual;
      engram_3.stimulus._36_4_ = 0;
      memcpy(local_c0,&stimulus,0x28);
      std::vector<AI::Engram,_std::allocator<AI::Engram>_>::push_back
                (engrams,(value_type *)local_c0);
    }
  }
  return;
}

Assistant:

void encodeEngramIfUnique(Stimulus stimulus, std::vector<Engram>& engrams)
	{		
		if (stimulus.type == StimulusType::Auditory)
		{
			bool heardBefore = false;

			for(auto& engram : engrams)
			{
				if (engram.type == EngramType::Heard)
				{					
					if (engram.stimulus.auditory.tag == stimulus.auditory.tag
						&& (engram.stimulus.x == stimulus.x
							&& engram.stimulus.y == stimulus.y))
					{
						heardBefore = true;						
					}					
				}
			}

			if (!heardBefore)
			{
				Engram engram;
				engram.type = EngramType::Heard;
				engram.age = 0;
				engram.stimulus = stimulus;

				engrams.push_back(engram);
			}
		}
		else 
		{
			bool seenBefore = false;

			for(auto& engram : engrams)
			{
				if (engram.type == EngramType::Saw)
				{
					if (engram.stimulus.visual.tag == stimulus.visual.tag
						&& (engram.stimulus.x == stimulus.x
							&& engram.stimulus.y == stimulus.y)
						&& engram.stimulus.visual.target == stimulus.visual.target)
					{
						seenBefore = true;
					}
				}
			}

			if (!seenBefore)
			{
				Engram engram;
				engram.type = EngramType::Saw;
				engram.age = 0;
				engram.stimulus = stimulus;

				engrams.push_back(engram);
			}
		}		
	}